

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O2

void __thiscall Balk::save_result(Balk *this,string *folder_name,size_t num_of_points)

{
  pointer psVar1;
  element_type *peVar2;
  ostream *poVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  shared_ptr<Term> *el;
  pointer psVar7;
  int i;
  size_t sVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar9;
  double dVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_29c;
  allocator<char> local_29b;
  allocator<char> local_29a;
  allocator<char> local_299;
  size_t local_298;
  double local_290;
  string *local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  path p;
  ofstream file;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [416];
  
  local_298 = num_of_points;
  local_288 = folder_name;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,"out1.txt",(allocator<char> *)&p);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"out2.txt",&local_299);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"out3.txt",&local_29a);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"out4.txt",&local_29b);
  __l._M_len = 4;
  __l._M_array = (iterator)&file;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&outputs,__l,&local_29c);
  lVar5 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(&file + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  dVar9 = ((double)CONCAT44(0x45300000,(int)(local_298 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_298) - 4503599627370496.0);
  uVar6 = 0;
  while( true ) {
    if ((ulong)((long)outputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)outputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) break;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&p,local_288,auto_format);
    std::filesystem::__cxx11::path::operator/=
              (&p,outputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar6);
    std::ofstream::ofstream(&file);
    std::ofstream::open((char *)&file,(_Ios_Openmode)p._M_pathname._M_dataplus._M_p);
    for (sVar8 = 0; sVar8 != local_298; sVar8 = sVar8 + 1) {
      psVar1 = (this->terms).
               super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      iVar4 = 0;
      dVar10 = 0.0;
      for (psVar7 = (this->terms).
                    super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1
          ) {
        peVar2 = (psVar7->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_290 = dVar10;
        if (peVar2->is_unknown == false) {
          (*peVar2->_vptr_Term[2])
                    ((this->segment_length * (double)(this->balk_size * (int)sVar8)) / dVar9,peVar2,
                     uVar6 & 0xffffffff);
          dVar10 = extraout_XMM0_Qa_00;
        }
        else {
          (*peVar2->_vptr_Term[2])
                    ((this->segment_length * (double)(this->balk_size * (int)sVar8)) / dVar9,peVar2,
                     uVar6 & 0xffffffff);
          lVar5 = (long)iVar4;
          iVar4 = iVar4 + 1;
          dVar10 = extraout_XMM0_Qa *
                   (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5];
        }
        dVar10 = local_290 + dVar10;
      }
      if (uVar6 < 2) {
        dVar10 = dVar10 / (this->E * this->J);
      }
      poVar3 = std::ostream::_M_insert<double>(dVar10);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&file);
    std::filesystem::__cxx11::path::~path(&p);
    uVar6 = uVar6 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  return;
}

Assistant:

void Balk::save_result(const std::string &folder_name, size_t num_of_points)
{
    std::vector<std::string> outputs = {"out1.txt", "out2.txt", "out3.txt", "out4.txt"};
    for (int num = 0; num < outputs.size(); ++num)
    {
        std::filesystem::path p = folder_name;
        p /= outputs[num];
        std::ofstream file;
        file.open(p);

        for (int i = 0; i < num_of_points; ++i)
        {
            double res = 0;
            int ind = 0;
            for (const auto &el : terms)
            {
                if (!(el->isUnknown()))
                {
                    res += el->calculate(i * balk_size * segment_length / num_of_points, num);
                }
                else
                {
                    res += el->calculate(i * balk_size * segment_length / num_of_points, num) * x[ind++];
                }
            }
            if (num <= 1) 
            {
                res /= (E * J);
            }
            file << res << std::endl;
        }
        file.close();
    }
}